

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O0

void __thiscall AddrManImpl::SetServices_(AddrManImpl *this,CService *addr,ServiceFlags nServices)

{
  long lVar1;
  AddrInfo *pAVar2;
  nid_type *in_RDX;
  CService *in_RSI;
  AddrManImpl *in_RDI;
  long in_FS_OFFSET;
  AddrInfo *info;
  AddrInfo *pinfo;
  char *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::mutex>>
            (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,(int)((ulong)in_RDI >> 0x20),
             (AnnotatedMixin<std::mutex> *)0xee76a6);
  pAVar2 = Find(in_RDI,in_RSI,in_RDX);
  if (pAVar2 != (AddrInfo *)0x0) {
    (pAVar2->super_CAddress).nServices = (ServiceFlags)in_RDX;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void AddrManImpl::SetServices_(const CService& addr, ServiceFlags nServices)
{
    AssertLockHeld(cs);

    AddrInfo* pinfo = Find(addr);

    // if not found, bail out
    if (!pinfo)
        return;

    AddrInfo& info = *pinfo;

    // update info
    info.nServices = nServices;
}